

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O3

void __thiscall llbuild::basic::ProcessGroup::~ProcessGroup(ProcessGroup *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((this->processes)._M_h._M_element_count != 0) {
    do {
      std::condition_variable::wait((unique_lock *)&this->processesCondition);
    } while ((this->processes)._M_h._M_element_count != 0);
    if ((local_28._M_owns & 1U) == 0) goto LAB_001403bb;
  }
  std::unique_lock<std::mutex>::unlock(&local_28);
LAB_001403bb:
  std::condition_variable::~condition_variable(&this->processesCondition);
  std::
  _Hashtable<int,_std::pair<const_int,_llbuild::basic::ProcessInfo>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_llbuild::basic::ProcessInfo>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this);
  return;
}

Assistant:

ProcessGroup::~ProcessGroup() {
  // Wait for all processes in the process group to terminate
  std::unique_lock<std::mutex> lock(mutex);
  while (!processes.empty()) {
    processesCondition.wait(lock);
  }
}